

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::ErrnoLogMessage::~ErrnoLogMessage(ErrnoLogMessage *this)

{
  ostream *poVar1;
  int err;
  string local_30;
  
  poVar1 = std::operator<<(&(((this->super_LogMessage).data_)->stream_).super_ostream,": ");
  StrError_abi_cxx11_(&local_30,
                      (google *)(ulong)(uint)((this->super_LogMessage).data_)->preserved_errno_,err)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  poVar1 = std::operator<<(poVar1," [");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((this->super_LogMessage).data_)->preserved_errno_);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_30);
  LogMessage::~LogMessage(&this->super_LogMessage);
  return;
}

Assistant:

ErrnoLogMessage::~ErrnoLogMessage() {
  // Don't access errno directly because it may have been altered
  // while streaming the message.
  stream() << ": " << StrError(preserved_errno()) << " [" << preserved_errno()
           << "]";
}